

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

QRgb findNearestColor(QRgb color,QRasterBuffer *rbuf)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  uVar1 = rbuf->destColor0;
  uVar2 = rbuf->destColor1;
  uVar3 = color >> 0x10 & 0xff;
  uVar5 = color >> 8 & 0xff;
  iVar9 = uVar3 - (uVar1 >> 0x10 & 0xff);
  iVar10 = uVar5 - (uVar1 >> 8 & 0xff);
  iVar8 = (color & 0xff) - (uVar1 & 0xff);
  iVar4 = uVar3 - (uVar2 >> 0x10 & 0xff);
  iVar6 = uVar5 - (uVar2 >> 8 & 0xff);
  iVar7 = (color & 0xff) - (uVar2 & 0xff);
  if ((uint)(iVar8 * iVar8 + iVar10 * iVar10 + iVar9 * iVar9) <
      (uint)(iVar7 * iVar7 + iVar6 * iVar6 + iVar4 * iVar4)) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

static inline QRgb findNearestColor(QRgb color, QRasterBuffer *rbuf)
{
    const QRgb color_0 = rbuf->destColor0;
    const QRgb color_1 = rbuf->destColor1;

    int r = qRed(color);
    int g = qGreen(color);
    int b = qBlue(color);
    int rx, gx, bx;
    int dist_0, dist_1;

    rx = r - qRed(color_0);
    gx = g - qGreen(color_0);
    bx = b - qBlue(color_0);
    dist_0 = rx*rx + gx*gx + bx*bx;

    rx = r - qRed(color_1);
    gx = g - qGreen(color_1);
    bx = b - qBlue(color_1);
    dist_1 = rx*rx + gx*gx + bx*bx;

    if (dist_0 < dist_1)
        return color_0;
    return color_1;
}